

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyAsciiToHex(sxi32 c)

{
  uint uVar1;
  
  if (c - 0x61U < 6) {
    return c + -0x57;
  }
  uVar1 = c - 0x30U;
  if (9 < c - 0x30U) {
    uVar1 = 0;
    if (c - 0x41U < 6) {
      uVar1 = c - 0x37;
    }
  }
  return uVar1;
}

Assistant:

static sxi32 SyAsciiToHex(sxi32 c)
{
	if( c >= 'a' && c <= 'f' ){
		c += 10 - 'a';
		return c;
	}
	if( c >= '0' && c <= '9' ){
		c -= '0';
		return c;
	}
	if( c >= 'A' && c <= 'F') {
		c += 10 - 'A';
		return c;
	}		
	return 0; 
}